

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O0

int Sim_SymmsIsCompatibleWithGroup(uint uSymm,Vec_Ptr_t *vNodesPi,int *pMap)

{
  Abc_Obj_t *pAVar1;
  int local_3c;
  int local_38;
  int fHasVar2;
  int fHasVar1;
  int Ind2;
  int Ind1;
  int i;
  Abc_Obj_t *pNode;
  int *pMap_local;
  Vec_Ptr_t *vNodesPi_local;
  uint uSymm_local;
  
  if (vNodesPi->nSize == 0) {
    vNodesPi_local._4_4_ = 1;
  }
  else {
    local_3c = 0;
    local_38 = 0;
    for (Ind2 = 0; Ind2 < vNodesPi->nSize; Ind2 = Ind2 + 1) {
      pAVar1 = Abc_ObjRegular((Abc_Obj_t *)vNodesPi->pArray[Ind2]);
      if (pMap[pAVar1->Id] == (uSymm & 0xffff)) {
        local_38 = 1;
      }
      else if (pMap[pAVar1->Id] == uSymm >> 0x10) {
        local_3c = 1;
      }
    }
    vNodesPi_local._4_4_ = (uint)(local_38 == local_3c);
  }
  return vNodesPi_local._4_4_;
}

Assistant:

int Sim_SymmsIsCompatibleWithGroup( unsigned uSymm, Vec_Ptr_t * vNodesPi, int * pMap )
{
    Abc_Obj_t * pNode;
    int i, Ind1, Ind2, fHasVar1, fHasVar2;

    if ( vNodesPi->nSize == 0 )
        return 1;

    // get the indices of the PI variables
    Ind1 = (uSymm & 0xffff);
    Ind2 = (uSymm >> 16);

    // go through the PI nodes
    fHasVar1 = fHasVar2 = 0;
    for ( i = 0; i < vNodesPi->nSize; i++ )
    {
        pNode = Abc_ObjRegular((Abc_Obj_t *)vNodesPi->pArray[i]);
        if ( pMap[pNode->Id] == Ind1 )
            fHasVar1 = 1;
        else if ( pMap[pNode->Id] == Ind2 )
            fHasVar2 = 1;
    }
    return fHasVar1 == fHasVar2;
}